

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_GetConicEquationThrough6Points
               (int stride,double *points2d,double *conic,double *max_pivot,double *min_pivot,
               double *zero_pivot)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_2c0;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  uint local_288;
  int k;
  int j;
  int i;
  double *p;
  double min_piv;
  double max_piv;
  double N [5] [5];
  double local_198;
  double M [5] [5];
  double y;
  double x;
  double scale;
  ON_2dPoint bboxmax;
  ON_2dPoint bboxmin;
  ON_2dPoint pts [6];
  double *zero_pivot_local;
  double *min_pivot_local;
  double *max_pivot_local;
  double *conic_local;
  double *points2d_local;
  int stride_local;
  
  if (conic == (double *)0x0) {
    points2d_local._7_1_ = false;
  }
  else {
    pts[5].y = (double)zero_pivot;
    memset(conic,0,0x30);
    if (max_pivot != (double *)0x0) {
      *max_pivot = 0.0;
    }
    if (min_pivot != (double *)0x0) {
      *min_pivot = 0.0;
    }
    if (pts[5].y != 0.0) {
      *(undefined8 *)pts[5].y = 0;
    }
    scale = *points2d;
    bboxmax.x = points2d[1];
    bboxmin.x = bboxmax.x;
    bboxmin.y = scale;
    pts[0].x = bboxmax.x;
    bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&bboxmin.y);
    if (bVar1) {
      bboxmax.y = scale;
      conic_local = points2d;
      for (k = 1; k < 6; k = k + 1) {
        conic_local = conic_local + stride;
        pts[(long)k + -1].y = *conic_local;
        pts[k].x = conic_local[1];
        bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&pts[(long)k + -1].y);
        if (!bVar1) {
          return false;
        }
        if (bboxmax.y <= pts[(long)k + -1].y) {
          if (scale < pts[(long)k + -1].y) {
            scale = pts[(long)k + -1].y;
          }
        }
        else {
          bboxmax.y = pts[(long)k + -1].y;
        }
        if (bboxmin.x <= pts[k].x) {
          if (bboxmax.x < pts[k].x) {
            bboxmax.x = pts[k].x;
          }
        }
        else {
          bboxmin.x = pts[k].x;
        }
      }
      dVar5 = scale - bboxmax.y;
      dVar6 = bboxmax.x - bboxmin.x;
      if (dVar5 < dVar6) {
        M[4][4] = dVar6;
        dVar5 = sqrt((dVar5 / dVar6) * (dVar5 / dVar6) + 1.0);
        x = dVar6 * dVar5;
      }
      else {
        if (dVar5 <= 0.0) {
          return false;
        }
        M[4][4] = dVar6 / dVar5;
        dVar6 = sqrt(M[4][4] * M[4][4] + 1.0);
        x = dVar5 * dVar6;
      }
      if (x <= 0.0) {
        points2d_local._7_1_ = false;
      }
      else {
        dVar5 = 1.0 / x;
        for (k = 0; k < 5; k = k + 1) {
          dVar6 = dVar5 * (pts[(long)k + -1].y - pts[4].y);
          M[4][4] = dVar5 * (pts[k].x - pts[5].x);
          M[(long)k + -1][4] = dVar6 * dVar6;
          M[k][0] = dVar6 * M[4][4];
          M[k][1] = M[4][4] * M[4][4];
          M[k][2] = dVar6;
          M[k][3] = M[4][4];
        }
        memset(&max_piv,0,200);
        N[4][3] = 1.0;
        N[3][2] = 1.0;
        N[2][1] = 1.0;
        N[1][0] = 1.0;
        max_piv = 1.0;
        local_288 = 0;
        y = ABS(local_198);
        _j = &local_198;
        for (k = 1; dVar6 = y, k < 0x19; k = k + 1) {
          M[4][4] = ABS(_j[1]);
          if (y < M[4][4]) {
            local_288 = k;
            y = M[4][4];
          }
          _j = _j + 1;
        }
        min_piv = y;
        if ((y != 0.0) || (NAN(y))) {
          iVar2 = (int)local_288 / 5;
          iVar4 = (int)local_288 % 5;
          if (iVar2 != 0) {
            for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
              M[4][4] = M[-1][(long)A._4_4_ + 4];
              M[-1][(long)A._4_4_ + 4] = M[(long)iVar2 + -1][(long)A._4_4_ + 4];
              M[(long)iVar2 + -1][(long)A._4_4_ + 4] = M[4][4];
            }
          }
          if (iVar4 != 0) {
            for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
              M[4][4] = M[(long)A._4_4_ + -1][4];
              M[(long)A._4_4_ + -1][4] = M[(long)A._4_4_ + -1][(long)iVar4 + 4];
              M[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
              M[4][4] = N[(long)A._4_4_ + -1][4];
              N[(long)A._4_4_ + -1][4] = N[(long)A._4_4_ + -1][(long)iVar4 + 4];
              N[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
            }
          }
          dVar7 = 1.0 / local_198;
          local_198 = 1.0;
          M[0][0] = dVar7 * M[0][0];
          M[0][1] = dVar7 * M[0][1];
          M[0][2] = dVar7 * M[0][2];
          M[0][3] = dVar7 * M[0][3];
          for (k = 1; k < 5; k = k + 1) {
            M[4][4] = -M[(long)k + -1][4];
            if ((M[4][4] != 0.0) || (NAN(M[4][4]))) {
              M[(long)k + -1][4] = 0.0;
              M[k][0] = M[4][4] * M[0][0] + M[k][0];
              M[k][1] = M[4][4] * M[0][1] + M[k][1];
              M[k][2] = M[4][4] * M[0][2] + M[k][2];
              M[k][3] = M[4][4] * M[0][3] + M[k][3];
            }
          }
          local_288 = 6;
          y = ABS(M[1][0]);
          k = 7;
          _j = M[1];
          for (; k < 0x19; k = k + 1) {
            M[4][4] = ABS(_j[1]);
            if (y < M[4][4]) {
              local_288 = k;
              y = M[4][4];
            }
            _j = _j + 1;
          }
          if (dVar6 < y) {
            min_piv = y;
          }
          if ((y != 0.0) || (NAN(y))) {
            iVar2 = (int)local_288 / 5;
            iVar4 = (int)local_288 % 5;
            if (1 < iVar2) {
              for (A._4_4_ = 1; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                M[4][4] = M[0][(long)A._4_4_ + 4];
                M[0][(long)A._4_4_ + 4] = M[(long)iVar2 + -1][(long)A._4_4_ + 4];
                M[(long)iVar2 + -1][(long)A._4_4_ + 4] = M[4][4];
              }
            }
            if (1 < iVar4) {
              for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                M[4][4] = M[A._4_4_][0];
                M[A._4_4_][0] = M[(long)A._4_4_ + -1][(long)iVar4 + 4];
                M[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
                M[4][4] = N[A._4_4_][0];
                N[A._4_4_][0] = N[(long)A._4_4_ + -1][(long)iVar4 + 4];
                N[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
              }
            }
            dVar6 = 1.0 / M[1][0];
            M[1][0] = 1.0;
            M[1][1] = dVar6 * M[1][1];
            M[1][2] = dVar6 * M[1][2];
            M[1][3] = dVar6 * M[1][3];
            for (k = 2; k < 5; k = k + 1) {
              M[4][4] = -M[k][0];
              if ((M[4][4] != 0.0) || (NAN(M[4][4]))) {
                M[k][0] = 0.0;
                M[k][1] = M[4][4] * M[1][1] + M[k][1];
                M[k][2] = M[4][4] * M[1][2] + M[k][2];
                M[k][3] = M[4][4] * M[1][3] + M[k][3];
              }
            }
            local_288 = 0xc;
            _j = M[2];
            y = ABS(M[2][1]);
            for (k = 0xd; _j = _j + 1, k < 0x19; k = k + 1) {
              M[4][4] = ABS(_j[1]);
              if (y < M[4][4]) {
                local_288 = k;
                y = M[4][4];
              }
            }
            if (min_piv < y) {
              min_piv = y;
            }
            if ((y != 0.0) || (NAN(y))) {
              iVar2 = (int)local_288 / 5;
              iVar4 = (int)local_288 % 5;
              if (2 < iVar2) {
                for (A._4_4_ = 2; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                  M[4][4] = M[1][(long)A._4_4_ + 4];
                  M[1][(long)A._4_4_ + 4] = M[(long)iVar2 + -1][(long)A._4_4_ + 4];
                  M[(long)iVar2 + -1][(long)A._4_4_ + 4] = M[4][4];
                }
              }
              if (2 < iVar4) {
                for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                  M[4][4] = M[A._4_4_][1];
                  M[A._4_4_][1] = M[(long)A._4_4_ + -1][(long)iVar4 + 4];
                  M[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
                  M[4][4] = N[A._4_4_][1];
                  N[A._4_4_][1] = N[(long)A._4_4_ + -1][(long)iVar4 + 4];
                  N[(long)A._4_4_ + -1][(long)iVar4 + 4] = M[4][4];
                }
              }
              dVar6 = 1.0 / M[2][1];
              M[2][1] = 1.0;
              M[2][2] = dVar6 * M[2][2];
              M[2][3] = dVar6 * M[2][3];
              for (k = 3; dVar7 = M[3][3], dVar6 = M[3][2], k < 5; k = k + 1) {
                M[4][4] = -M[k][1];
                if ((M[4][4] != 0.0) || (NAN(M[4][4]))) {
                  M[k][1] = 0.0;
                  M[k][2] = M[4][4] * M[2][2] + M[k][2];
                  M[k][3] = M[4][4] * M[2][3] + M[k][3];
                }
              }
              local_288 = 3;
              k = 3;
              y = ABS(M[3][2]);
              if (ABS(M[3][2]) < ABS(M[3][3])) {
                local_288 = 4;
                y = ABS(M[3][3]);
              }
              if (y < ABS(M[4][2])) {
                k = 4;
                local_288 = 3;
                y = ABS(M[4][2]);
              }
              M[4][4] = ABS(M[4][3]);
              if (y < M[4][4]) {
                local_288 = 4;
                k = 4;
                y = M[4][4];
              }
              if (min_piv < y) {
                min_piv = y;
              }
              if ((y != 0.0) || (NAN(y))) {
                if (3 < (uint)k) {
                  M[3][2] = M[4][2];
                  M[4][2] = dVar6;
                  M[4][4] = M[3][3];
                  M[3][3] = M[k][3];
                  M[4][3] = dVar7;
                }
                if (3 < local_288) {
                  for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                    M[4][4] = M[A._4_4_][2];
                    M[A._4_4_][2] = M[A._4_4_][3];
                    M[A._4_4_][3] = M[4][4];
                    M[4][4] = N[A._4_4_][2];
                    N[A._4_4_][2] = N[A._4_4_][3];
                    N[A._4_4_][3] = M[4][4];
                  }
                }
                dVar6 = 1.0 / M[3][2];
                M[3][2] = 1.0;
                M[3][3] = dVar6 * M[3][3];
                if ((M[4][2] != 0.0) || (NAN(M[4][2]))) {
                  M[4][3] = -M[4][2] * M[3][3] + M[4][3];
                  M[4][2] = 0.0;
                }
                if (max_pivot != (double *)0x0) {
                  *max_pivot = min_piv;
                }
                if (min_pivot != (double *)0x0) {
                  *min_pivot = min_piv;
                }
                if (pts[5].y != 0.0) {
                  *(ulong *)pts[5].y = (ulong)M[4][3] & (ulong)DAT_009d3010;
                }
                for (k = 0; dVar6 = N[4][3], local_288 = k, k < 4; k = k + 1) {
                  while (local_288 = local_288 + 1, (int)local_288 < 5) {
                    M[4][4] = -M[(long)k + -1][(long)(int)local_288 + 4];
                    if ((M[4][4] != 0.0) || (NAN(M[4][4]))) {
                      for (A._4_4_ = 0; A._4_4_ < 5; A._4_4_ = A._4_4_ + 1) {
                        N[(long)A._4_4_ + -1][(long)(int)local_288 + 4] =
                             M[4][4] * N[(long)A._4_4_ + -1][(long)k + 4] +
                             N[(long)A._4_4_ + -1][(long)(int)local_288 + 4];
                      }
                    }
                  }
                }
                bVar1 = ON_IsDegenrateConicHelper(N[0][3],N[1][3],N[2][3],N[3][3],N[4][3]);
                if (bVar1) {
                  points2d_local._7_1_ = false;
                }
                else {
                  dVar7 = dVar5 * dVar5;
                  B = dVar7 * N[0][3];
                  C = dVar7 * N[1][3];
                  D = dVar7 * N[2][3];
                  dVar7 = -pts[4].y;
                  dVar3 = -pts[5].x;
                  local_2c0 = dVar5 * dVar6 * dVar3 +
                              dVar5 * N[3][3] * dVar7 +
                              D * dVar3 * dVar3 + B * dVar7 * dVar7 + C * dVar7 * dVar3;
                  E = B * 2.0 * dVar7 + C * dVar3 + dVar5 * N[3][3];
                  F = D * 2.0 * dVar3 + C * dVar7 + dVar5 * dVar6;
                  dVar5 = D;
                  if (ABS(D) <= ABS(B)) {
                    dVar5 = B;
                  }
                  if (dVar5 < 0.0) {
                    B = -B;
                    C = -C;
                    D = -D;
                    E = -E;
                    F = -F;
                    local_2c0 = -local_2c0;
                  }
                  *conic = B;
                  conic[1] = C;
                  conic[2] = D;
                  conic[3] = E;
                  conic[4] = F;
                  conic[5] = local_2c0;
                  local_288 = 0;
                  y = ABS(*conic);
                  for (k = 0; k < 6; k = k + 1) {
                    if (y < ABS(conic[k])) {
                      local_288 = k;
                      y = ABS(conic[k]);
                    }
                  }
                  if ((conic[(int)local_288] != 0.0) || (NAN(conic[(int)local_288]))) {
                    dVar5 = 1.0 / conic[(int)local_288];
                    *conic = dVar5 * *conic;
                    conic[1] = dVar5 * conic[1];
                    conic[2] = dVar5 * conic[2];
                    conic[3] = dVar5 * conic[3];
                    conic[4] = dVar5 * conic[4];
                    conic[5] = dVar5 * conic[5];
                    conic[(int)local_288] = 1.0;
                    points2d_local._7_1_ = true;
                  }
                  else {
                    points2d_local._7_1_ = false;
                  }
                }
              }
              else {
                if (max_pivot != (double *)0x0) {
                  *max_pivot = min_piv;
                }
                points2d_local._7_1_ = false;
              }
            }
            else {
              if (max_pivot != (double *)0x0) {
                *max_pivot = min_piv;
              }
              points2d_local._7_1_ = false;
            }
          }
          else {
            if (max_pivot != (double *)0x0) {
              *max_pivot = min_piv;
            }
            points2d_local._7_1_ = false;
          }
        }
        else {
          points2d_local._7_1_ = false;
        }
      }
    }
    else {
      points2d_local._7_1_ = false;
    }
  }
  return points2d_local._7_1_;
}

Assistant:

bool ON_GetConicEquationThrough6Points( 
        int stride, 
        const double* points2d, 
        double conic[6],
        double* max_pivot,
        double* min_pivot,
        double* zero_pivot
        )
{
  // Sets conic[] to the coefficients = (A,B,C,D,E,F),
  // such that A*x*x + B*x*y + C*y*y + D*x + E*y + F = 0
  // for each of the 6 input points.

  // This code is long and ugly.  The reason for unrolling the 
  // obvious loops is to make it as efficient as possible.  
  // Rhino calls this function in time critical situations.
  //

  ON_2dPoint pts[6], bboxmin, bboxmax;
  double scale, x, y, M[5][5], N[5][5], max_piv, min_piv;
  const double* p;
  int i, j, k;

  if ( 0 == conic )
    return false;
  memset(conic,0,6*sizeof(conic[0]));
  if ( max_pivot )
    *max_pivot = 0.0;
  if ( min_pivot )
    *min_pivot = 0.0;
  if ( zero_pivot )
    *zero_pivot = 0.0;

  // copy input points into pts[6] and calculate bounding box
  bboxmin.x = bboxmax.x = pts[0].x = points2d[0];
  bboxmin.y = bboxmax.y = pts[0].y = points2d[1];
  if ( !pts[0].IsValid() )
    return false;
  for ( i = 1; i < 6; i++ )
  {
    points2d += stride;
    pts[i].x = points2d[0];
    pts[i].y = points2d[1];
    if ( !pts[i].IsValid() )
      return false;
    if ( pts[i].x < bboxmin.x ) bboxmin.x = pts[i].x; 
    else if ( pts[i].x > bboxmax.x ) bboxmax.x = pts[i].x;
    if ( pts[i].y < bboxmin.y ) bboxmin.y = pts[i].y; 
    else if ( pts[i].y > bboxmax.y ) bboxmax.y = pts[i].y;
  }

  // translate and scale pts[] so pts[5] is at the origin and
  // (pts[0],...pts[4]) have and have a "diameter" near 1.
  // This keeps the starting coefficients in M[][] less than 5
  // with the largest generally near one.
  x = bboxmax.x-bboxmin.x;
  y = bboxmax.y-bboxmin.y;
  if ( x >= y )
  {
    if ( x > 0.0 )
    {
      y /= x;
      scale = x*sqrt(1.0 + y*y);
    }
    else
      return false;
  }
  else 
  {
    x /= y;
    scale = y*sqrt(1.0 + x*x);
  }
  if ( scale > 0.0 )
    scale = 1.0/scale;
  else
    return false;

  for ( i = 0; i < 5; i++ )
  {
    x = scale*(pts[i].x - pts[5].x);
    y = scale*(pts[i].y - pts[5].y);
    M[i][0] = x*x;
    M[i][1] = x*y;
    M[i][2] = y*y;
    M[i][3] = x;
    M[i][4] = y;
  }

  memset( N,0,sizeof(N) );
  N[0][0] = N[1][1] = N[2][2] = N[3][3] = N[4][4] = 1.0;

  // The conic (A,B,C,D,E) is the kernel of M.

  //////////////////////////////////////////////////////////
  //
  // find first pivot
  //
  j = 0;
  p = &M[0][0];
  x = fabs(*p);
  for ( i = 1; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  max_piv = min_piv = x;
  if ( 0.0 == x )
    return false; // all input points are equal
  i = j/5;
  j %= 5;

  if ( 0 != i )
  {
    // swap rows M[0][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[0][k]; M[0][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( 0 != j )
  {
    // Swap columns M[][0] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][0]; M[k][0] = M[k][j]; M[k][j] = y;
      y = N[k][0]; N[k][0] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[0][] so that M[0][0] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[0][0];
  M[0][0] = 1.0; 
  M[0][1] *= x; M[0][2] *= x; M[0][3] *= x; M[0][4] *= x;

  // kill column M[1,2,3,4][0]
  for ( i = 1; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][0]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][0] = 0.0; // set to zero so search for pivot is faster
      M[i][1] += y*M[0][1]; M[i][2] += y*M[0][2]; M[i][3] += y*M[0][3]; M[i][4] += y*M[0][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find second pivot
  //
  j = 6;
  p = &M[1][1];
  x = fabs(*p);
  for ( i = 7; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // two distinct points in input point list.
  }
  i = j/5;  // should always be >= 1
  j %= 5;   // should always be >= 1

  if ( i > 1 )
  {
    // swap rows M[1][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 1; k < 5; k++ )
    {
      y = M[1][k]; M[1][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 1 )
  {
    // Swap columns M[][1] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][1]; M[k][1] = M[k][j]; M[k][j] = y;
      y = N[k][1]; N[k][1] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[1][] so that M[1][1] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[1][1];
  M[1][1] = 1.0; 
  M[1][2] *= x; M[1][3] *= x; M[1][4] *= x;

  // kill column M[2,3,4][1]
  for ( i = 2; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][1]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][1] = 0.0; // set to zero so search for pivot is faster
      M[i][2] += y*M[1][2]; M[i][3] += y*M[1][3]; M[i][4] += y*M[1][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find third pivot
  //
  j = 12;
  p = &M[2][2];
  x = fabs(*p);
  for ( i = 13; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // three distinct points in input point list.
  }
  i = j/5;  // should always be >= 2
  j %= 5;   // should always be >= 2

  if ( i > 2 )
  {
    // swap rows M[2][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 2; k < 5; k++ )
    {
      y = M[2][k]; M[2][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 2 )
  {
    // Swap columns M[][2] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][2]; M[k][2] = M[k][j]; M[k][j] = y;
      y = N[k][2]; N[k][2] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[2][] so that M[2][2] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[2][2];
  M[2][2] = 1.0; M[2][3] *= x; M[2][4] *= x;

  // kill column M[3,4][2]
  for ( i = 3; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][2]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][2] = 0.0; // set to zero so search for pivot is faster
      M[i][3] += y*M[2][3]; M[i][4] += y*M[2][4];
    }
  }

  //////////////////////////////////////////////////////////
  //
  // find fourth pivot
  //
  i = j = 3;
  x = fabs(M[3][3]);
  if ( x < (y = fabs(M[3][4])) )
  {
    x = y; j = 4;
  }
  if ( x < (y = fabs(M[4][3])) )
  {
    x = y; i = 4; j = 3;
  }
  if ( x < (y = fabs(M[4][4])) )
  {
    x = y; i = j = 4;
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // four distinct points in the input point list.
  }

  if ( i > 3 )
  {
    // swap rows M[3][] and M[i][]
    // Do not modify N[][] because row ops act on the left of M.
    y = M[3][3]; M[3][3] = M[4][3]; M[4][3] = y;
    y = M[3][4]; M[3][4] = M[i][4]; M[4][4] = y;
  }
  if ( j > 3 )
  {
    // Swap columns M[][3] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][3]; M[k][3] = M[k][4]; M[k][4] = y;
      y = N[k][3]; N[k][3] = N[k][4]; N[k][4] = y;
    }
  }

  // scale row M[3][] so that M[3][3] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[3][3];
  M[3][3] = 1.0; 
  M[3][4] *= x;

  // kill column M[4][3]
  if ( 0.0 != M[4][3] )
  {
    // use row op M[i][] += y*M[3][]
    // Do not modify N because row ops act on the left of M.
    M[4][4] -= M[4][3]*M[3][4];
    M[4][3] = 0.0; // set to zero so search for pivot is faster
  }

  // By construction, M[][] is singular and M[4][4] should be nearly zero.
  // It should be upper triangular with diagonal 1,1,1,1,0-ish
  if ( max_pivot )
    *max_pivot = max_piv;
  if ( min_pivot )
    *min_pivot = max_piv;
  if ( zero_pivot )
    *zero_pivot = fabs(M[4][4]);

  // Use column operations to make M[][] the identity.
  // The operations must also be applied to N[][] in order to
  // calculate the kernel of the original M[][].
  for ( i = 0; i < 4; i++ )
  {
    for (j = i+1; j < 5; j++ )
    {
      if ( 0.0 != (y = -M[i][j]) )
      {
        // waste of time // M[i][j] = 0.0;
        for ( k = 0; k < 5; k++ )
        {
          //M[k][j] += y*M[k][i];
          N[k][j] += y*N[k][i];
        }
      }
    }
  }

  // At this point, M[][] should be reduced to a diagonal matrix with 
  // 1,1,1,1,0 on the diagonal. The vector (A,B,C,D,E) = N*Transpose(0,0,0,0,1)
  // will be in the kernel of the original M[][]. The conic through the 
  // six points( scale*(pts[0]-pts[5]),...,scale*(pts[4]-pts[5]),(0,0) ) 
  // is Ax^2 + Bxy + Cy^2 + Dx + Ey = 0.
  // We need to apply the inverse of the scale and then translate by 
  // (pts[5].x,pts[5].y) to get the equation of the conic through the 
  // input point list.

  double A = N[0][4];
  double B = N[1][4];
  double C = N[2][4];
  double D = N[3][4];
  double E = N[4][4];
  // F = 0

  // check for collinear point set
  if ( ON_IsDegenrateConicHelper(A,B,C,D,E) )
  {
    // points lie on one or two lines
    return false;
  }

  // points are not collinear

  // undo the scale we applied when we calculated M[][]
  x = scale*scale;
  A *= x;
  B *= x;
  C *= x;
  D *= scale;
  E *= scale;

  // undo the translation of pts[5] to (0,0) we applied when we calculated M[][]
  x = -pts[5].x;
  y = -pts[5].y;
  double F = A*x*x + B*x*y + C*y*y + D*x + E*y;
  D += 2.0*A*x + B*y;
  E += 2.0*C*y + B*x;

  if ( (fabs(A) >= fabs(C)) ? (A<0.0):(C<0.0) )
  {
    // Make the largest A/C coefficient positive.
    A = -A; B = -B; C = -C; D = -D; E = -E; F = -F;
  }

  conic[0] = A; conic[1] = B; conic[2] = C;
  conic[3] = D; conic[4] = E; conic[5] = F;

  //
  j = 0;
  x = fabs(conic[0]);
  for ( i = 0; i < 6; i++ )
  {
    if ( x < (y = fabs(conic[i])) )
    {
      x = y;
      j = i;
    }
  }
  if ( !(conic[j] != 0.0) )
    return false;
  y = 1.0/conic[j];
  conic[0] *= y; conic[1] *= y; conic[2] *= y; 
  conic[3] *= y; conic[4] *= y; conic[5] *= y; 
  conic[j] = 1.0;

  return true;
}